

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

void Wlc_NtkFindOneNode(Wlc_Ntk_t *p,Wlc_Obj_t *pWlcObj,Gia_Man_t *pGia,Vec_Mem_t *vTtMem)

{
  uint uVar1;
  ulong uVar2;
  int nWords_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iObj;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  word *pOut;
  uint *puVar9;
  char *pcVar10;
  int fCompl;
  word *pInfoObj;
  int iLit;
  int iFirst;
  int nBits;
  int nWords;
  int Entry;
  int k;
  Vec_Mem_t *vTtMem_local;
  Gia_Man_t *pGia_local;
  Wlc_Obj_t *pWlcObj_local;
  Wlc_Ntk_t *p_local;
  
  nWords_00 = Vec_MemEntrySize(vTtMem);
  iVar3 = Wlc_ObjRange(pWlcObj);
  iVar4 = Wlc_ObjId(p,pWlcObj);
  iVar4 = Vec_IntEntry(&p->vCopies,iVar4);
  for (nWords = 0; nWords < iVar3; nWords = nWords + 1) {
    iVar5 = Vec_IntEntry(&p->vBits,iVar4 + nWords);
    iObj = Abc_Lit2Var(iVar5);
    pOut = Wlc_ObjSim(pGia,iObj);
    uVar2 = *pOut;
    if ((uVar2 & 1) != 0) {
      Abc_TtNot(pOut,nWords_00);
    }
    puVar9 = (uint *)Vec_MemHashLookup(vTtMem,pOut);
    uVar1 = *puVar9;
    if (0 < (int)uVar1) {
      uVar6 = Wlc_ObjId(p,pWlcObj);
      uVar7 = Wlc_ObjRange(pWlcObj);
      uVar8 = Abc_LitIsCompl(iVar5);
      iVar5 = Wlc_ObjId(p,pWlcObj);
      pcVar10 = Wlc_ObjName(p,iVar5);
      printf("Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n",(ulong)uVar6,(ulong)uVar7,
             (ulong)(uint)nWords,(ulong)uVar1,(ulong)((uint)uVar2 & 1 ^ uVar8),pcVar10);
    }
    if ((uVar2 & 1) != 0) {
      Abc_TtNot(pOut,nWords_00);
    }
  }
  return;
}

Assistant:

void Wlc_NtkFindOneNode( Wlc_Ntk_t * p, Wlc_Obj_t * pWlcObj, Gia_Man_t * pGia, Vec_Mem_t * vTtMem )
{
    int k, Entry;
    int nWords = Vec_MemEntrySize(vTtMem);
    int nBits = Wlc_ObjRange(pWlcObj);
    int iFirst = Vec_IntEntry( &p->vCopies, Wlc_ObjId(p, pWlcObj) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLit = Vec_IntEntry( &p->vBits, iFirst + k );
        word * pInfoObj = Wlc_ObjSim( pGia, Abc_Lit2Var(iLit) );
        int fCompl = pInfoObj[0] & 1;
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry > 0 )
            printf( "Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n", Wlc_ObjId(p, pWlcObj), Wlc_ObjRange(pWlcObj), k, Entry, fCompl ^ Abc_LitIsCompl(iLit), Wlc_ObjName(p, Wlc_ObjId(p, pWlcObj)) );
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        //printf( "%2d ", Entry );
        //Extra_PrintHex( stdout, (unsigned*)pInfoObj, 8 );
        //printf( "\n" );
    }
    //printf( "\n" );
}